

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O2

int link_detach(LINK_HANDLE link,_Bool close,char *error_condition,char *error_description,
               AMQP_VALUE info)

{
  LINK_STATE LVar1;
  int iVar2;
  ERROR_HANDLE error;
  LOGGER_LOG p_Var3;
  int iVar4;
  char *pcVar5;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x4cf;
    }
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
              "link_detach",0x4ce,1,"NULL link");
    return 0x4cf;
  }
  if (link->is_closed != false) {
    return 0;
  }
  if (error_condition == (char *)0x0) {
LAB_00112034:
    error = (ERROR_HANDLE)0x0;
  }
  else {
    error = error_create(error_condition);
    if (error == (ERROR_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00112034;
      pcVar5 = "Cannot create error for detach, detaching without error anyhow";
      error = (ERROR_HANDLE)0x0;
      iVar2 = 0x4de;
    }
    else {
      if (((error_description != (char *)0x0) &&
          (iVar2 = error_set_description(error,error_description), iVar2 != 0)) &&
         (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
        (*p_Var3)(AZ_LOG_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"link_detach",0x4e6,1,
                  "Cannot set error description on detach error, detaching anyhow");
      }
      if (((info == (AMQP_VALUE)0x0) || (iVar2 = error_set_info(error,info), iVar2 == 0)) ||
         (p_Var3 = xlogging_get_log_function(), p_Var3 == (LOGGER_LOG)0x0)) goto LAB_00112037;
      pcVar5 = "Cannot set info map on detach error, detaching anyhow";
      iVar2 = 0x4ee;
    }
    (*p_Var3)(AZ_LOG_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
              "link_detach",iVar2,1,pcVar5);
  }
LAB_00112037:
  LVar1 = link->link_state;
  if (LVar1 - LINK_STATE_HALF_ATTACHED_ATTACH_SENT < 2) {
    iVar2 = send_detach(link,close,error);
    if (iVar2 == 0) {
      LVar1 = LINK_STATE_DETACHED;
LAB_001120fd:
      set_link_state(link,LVar1);
      iVar2 = 0;
      goto LAB_00112106;
    }
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x500;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00112106;
    iVar4 = 0x4ff;
  }
  else {
    iVar2 = 0;
    if (LVar1 == LINK_STATE_DETACHED) goto LAB_00112106;
    if (LVar1 != LINK_STATE_ATTACHED) {
      iVar2 = 0x51f;
      goto LAB_00112106;
    }
    iVar2 = send_detach(link,close,error);
    if (iVar2 == 0) {
      LVar1 = LINK_STATE_HALF_ATTACHED_ATTACH_SENT;
      goto LAB_001120fd;
    }
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x50e;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00112106;
    iVar4 = 0x50d;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
            "link_detach",iVar4,1,"Sending detach frame failed");
LAB_00112106:
  if (error != (ERROR_HANDLE)0x0) {
    error_destroy(error);
  }
  return iVar2;
}

Assistant:

int link_detach(LINK_HANDLE link, bool close, const char* error_condition, const char* error_description, AMQP_VALUE info)
{
    int result;

    (void)error_condition;
    (void)error_description;
    (void)info;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else if (link->is_closed)
    {
        result = 0;
    }
    else
    {
        ERROR_HANDLE error;

        if (error_condition != NULL)
        {
            error = error_create(error_condition);
            if (error == NULL)
            {
                LogInfo("Cannot create error for detach, detaching without error anyhow");
            }
            else
            {
                if (error_description != NULL)
                {
                    if (error_set_description(error, error_description) != 0)
                    {
                        LogInfo("Cannot set error description on detach error, detaching anyhow");
                    }
                }

                if (info != NULL)
                {
                    if (error_set_info(error, info) != 0)
                    {
                        LogInfo("Cannot set info map on detach error, detaching anyhow");
                    }
                }
            }
        }
        else
        {
            error = NULL;
        }

        switch (link->link_state)
        {
        case LINK_STATE_HALF_ATTACHED_ATTACH_SENT:
        case LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED:
            /* Sending detach when remote is not yet attached */
            if (send_detach(link, close, error) != 0)
            {
                LogError("Sending detach frame failed");
                result = MU_FAILURE;
            }
            else
            {
                set_link_state(link, LINK_STATE_DETACHED);
                result = 0;
            }
            break;

        case LINK_STATE_ATTACHED:
            /* Send detach and wait for remote to respond */
            if (send_detach(link, close, error) != 0)
            {
                LogError("Sending detach frame failed");
                result = MU_FAILURE;
            }
            else
            {
                set_link_state(link, LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
                result = 0;
            }
            break;

        case LINK_STATE_DETACHED:
            /* Already detached */
            result = 0;
            break;

        default:
        case LINK_STATE_ERROR:
            /* Already detached and in error state */
            result = MU_FAILURE;
            break;
        }

        if (error != NULL)
        {
            error_destroy(error);
        }
    }

    return result;
}